

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

UnicodeString *
icu_63::DateTimePatternGenerator::staticGetBaseSkeleton
          (UnicodeString *__return_storage_ptr__,UnicodeString *pattern,UErrorCode *param_2)

{
  undefined1 local_de8 [8];
  PtnSkeleton localSkeleton;
  undefined1 local_d48 [8];
  DateTimeMatcher matcher;
  FormatParser fp;
  UErrorCode *param_1_local;
  UnicodeString *pattern_local;
  
  FormatParser::FormatParser((FormatParser *)&matcher.skeleton.addedDefaultDayPeriod);
  DateTimeMatcher::DateTimeMatcher((DateTimeMatcher *)local_d48);
  PtnSkeleton::PtnSkeleton((PtnSkeleton *)local_de8);
  DateTimeMatcher::set
            ((DateTimeMatcher *)local_d48,pattern,
             (FormatParser *)&matcher.skeleton.addedDefaultDayPeriod,(PtnSkeleton *)local_de8);
  PtnSkeleton::getBaseSkeleton(__return_storage_ptr__,(PtnSkeleton *)local_de8);
  PtnSkeleton::~PtnSkeleton((PtnSkeleton *)local_de8);
  DateTimeMatcher::~DateTimeMatcher((DateTimeMatcher *)local_d48);
  FormatParser::~FormatParser((FormatParser *)&matcher.skeleton.addedDefaultDayPeriod);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
DateTimePatternGenerator::staticGetBaseSkeleton(
        const UnicodeString& pattern, UErrorCode& /*status*/) {
    FormatParser fp;
    DateTimeMatcher matcher;
    PtnSkeleton localSkeleton;
    matcher.set(pattern, &fp, localSkeleton);
    return localSkeleton.getBaseSkeleton();
}